

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void __thiscall Hex::Hexdumper<unsigned_char>::dump(Hexdumper<unsigned_char> *this,ostream *os)

{
  char filler_00;
  bool bVar1;
  _Setfill<char> _Var2;
  fmtflags fVar3;
  _Ios_Fmtflags _Var4;
  _Ios_Fmtflags numberbase_00;
  _Ios_Fmtflags _Var5;
  _Ios_Fmtflags _Var6;
  _Ios_Fmtflags _Var7;
  _Ios_Fmtflags _Var8;
  int iVar9;
  _Setw _Var10;
  streamsize sVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uchar **ppuVar14;
  ostream *poVar15;
  void *pvVar16;
  uint64_t uVar17;
  bool bVar18;
  uchar *local_a8;
  uint64_t local_a0;
  undefined1 auStack_80 [4];
  int count;
  pair<const_unsigned_char_*,_const_unsigned_char_*> curline;
  uchar *local_68;
  uchar *pend;
  pair<const_unsigned_char_*,_const_unsigned_char_*> prevline;
  uchar *p;
  int threshold;
  uint64_t step;
  uint64_t ofs;
  bool summarize;
  bool uppercasehex;
  bool showoffset;
  bool showpos;
  bool showbase;
  int numberbase;
  int adjust;
  int unitsperline;
  char filler;
  ostream *os_local;
  Hexdumper<unsigned_char> *this_local;
  
  filler_00 = std::ios::fill();
  sVar11 = std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  numberbase = (int)sVar11;
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  _Var4 = std::operator&(fVar3,_S_adjustfield);
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  numberbase_00 = std::operator&(fVar3,_S_basefield);
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  _Var5 = std::operator&(fVar3,_S_showbase);
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  _Var6 = std::operator&(fVar3,_S_showpos);
  bVar18 = _Var6 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  _Var6 = std::operator&(fVar3,_S_showpoint);
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  _Var7 = std::operator&(fVar3,_S_uppercase);
  fVar3 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  _Var8 = std::operator&(fVar3,_S_skipws);
  if (_Var6 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    local_a0 = Hexdumper_base::getbaseofs(os);
  }
  else {
    local_a0 = 0;
  }
  step = local_a0;
  uVar12 = Hexdumper_base::getstep(os);
  uVar13 = Hexdumper_base::getthreshold(os);
  if (numberbase == -1) {
    if (_Var4 == _S_left) {
      numberbase = 0x20;
    }
    else if (bVar18) {
      numberbase = 0x10;
    }
    else {
      numberbase = 0x40;
    }
  }
  prevline.second = this->_first;
  _pend = std::make_pair<unsigned_char_const*&,unsigned_char_const*&>
                    (&prevline.second,&prevline.second);
  std::ostream::operator<<(os,std::right);
  std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0);
  do {
    if (this->_last <= prevline.second) {
      Hexdumper_base::clearflags(os);
      return;
    }
    if (numberbase == 0) {
      local_a8 = this->_last;
    }
    else {
      curline.second = prevline.second + numberbase;
      ppuVar14 = std::min<unsigned_char_const*>(&this->_last,&curline.second);
      local_a8 = *ppuVar14;
    }
    local_68 = local_a8;
    _auStack_80 = std::make_pair<unsigned_char_const*&,unsigned_char_const*&>
                            (&prevline.second,&local_68);
    if (_Var8 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
LAB_0016ae20:
      if (_Var6 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
        _Var10 = std::setw(8);
        poVar15 = std::operator<<(os,_Var10);
        _Var2 = std::setfill<char>('0');
        poVar15 = std::operator<<(poVar15,_Var2._M_c);
        pvVar16 = (void *)std::ostream::operator<<(poVar15,std::hex);
        poVar15 = (ostream *)std::ostream::operator<<(pvVar16,step);
        std::operator<<(poVar15,": ");
      }
      if (bVar18) {
        output_hex(os,_auStack_80,curline.first,filler_00,numberbase_00,
                   _Var5 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),
                   _Var7 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        if ((numberbase != 0) && ((long)local_68 - (long)prevline.second != (long)numberbase)) {
          output_padding(os,numberbase - ((int)local_68 - (int)prevline.second),filler_00);
        }
      }
      if ((bVar18) && (_Var4 != _S_left)) {
        std::operator<<(os,"  ");
      }
      if (_Var4 != _S_left) {
        output_asc(os,_auStack_80,curline.first);
        if ((numberbase != 0) && ((long)local_68 - (long)prevline.second != (long)numberbase)) {
          output_asc_padding(os,numberbase - ((int)local_68 - (int)prevline.second));
        }
      }
      if (numberbase != 0) {
        std::operator<<(os,"\n");
      }
    }
    else {
      bVar1 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
                        ((pair<const_unsigned_char_*,_const_unsigned_char_*> *)&pend,
                         (pair<const_unsigned_char_*,_const_unsigned_char_*> *)auStack_80);
      if (!bVar1) {
        std::pair<const_unsigned_char_*,_const_unsigned_char_*>::operator=
                  ((pair<const_unsigned_char_*,_const_unsigned_char_*> *)&pend,(type)auStack_80);
        goto LAB_0016ae20;
      }
      iVar9 = count_identical_lines(prevline.second,this->_last,numberbase);
      if (iVar9 <= (int)uVar13) goto LAB_0016ae20;
      poVar15 = std::operator<<(os,"* [ 0x");
      pvVar16 = (void *)std::ostream::operator<<(poVar15,std::hex);
      poVar15 = (ostream *)std::ostream::operator<<(pvVar16,iVar9);
      std::operator<<(poVar15," lines ]\n");
      local_68 = prevline.second + iVar9 * numberbase;
    }
    if (uVar12 == 0) {
      uVar17 = (long)local_68 - (long)prevline.second;
      prevline.second = local_68;
    }
    else {
      prevline.second = prevline.second + uVar12;
      uVar17 = uVar12;
    }
    step = uVar17 + step;
  } while( true );
}

Assistant:

void dump(std::ostream& os) const
    {
        // make copy of current 'os' settings
        char filler = os.fill();  // what to output between hex numbers.
        int unitsperline = os.width();  // when not set: everything on one line
        // upl == 0 -> everything on one line
        // upl ==-1 -> unspecified -> use defaults
        //int unitwidth = os.precision(); // NOT USED (yet)
        int adjust = os.flags() & os.adjustfield;
        int numberbase = os.flags() & os.basefield;

        bool showbase = os.flags() & os.showbase;
        bool showpos = os.flags() & os.showpos;
        bool showoffset = os.flags() & os.showpoint;
        bool uppercasehex = os.flags() & os.uppercase;
        bool summarize = os.flags() & os.skipws;

        uint64_t ofs = showoffset ? getbaseofs(os) : 0;
        uint64_t step = getstep(os);

        int threshold = getthreshold(os);

        // showpos adjust
        //   yes     left    %+-b     ...    invalid
        //   yes     right   %+b     asc only
        //   no      left    %-b     hex only
        //   no      right   %b      hex + asc

        if (unitsperline==-1) {
            if (adjust == os.left)
                unitsperline = 32 / sizeof(T);
            else if (showpos)
                unitsperline = 64 / sizeof(T);
            else
                unitsperline = 16 / sizeof(T);
        }

        auto p = _first;

        //auto prevp = p;
        auto prevline = std::make_pair(p, p);

        os << std::right;
        os.width(0);
        while (p < _last) {
            auto pend = unitsperline ? std::min(_last, p+unitsperline) : _last;
            auto curline = std::make_pair(p, pend);
            if (summarize) {
                if (data_is_equal(prevline, curline)) {
                    int count = count_identical_lines(p, _last, unitsperline);
                    if (count > threshold) {
                        os << "* [ 0x" << std::hex << count << " lines ]\n";
                        pend = p + count * unitsperline;

                        goto next;
                    }
                }
                else {
                    prevline = curline;
                }
            }

            if (showoffset)
                os << std::setw(8) << std::setfill('0') << std::hex << ofs << ": ";
            if (!showpos) {
                output_hex(os, curline.first, curline.second, filler, numberbase, showbase, uppercasehex);
                if (unitsperline && pend-p != unitsperline)
                    output_padding(os, unitsperline-(pend-p), filler);
            }

            if (!showpos && adjust != os.left)
                os << "  ";   // separate left from right
            if (adjust != os.left)
            {
                output_asc(os, curline.first, curline.second);
                if (unitsperline && pend-p != unitsperline)
                    output_asc_padding(os, unitsperline-(pend-p));
            }

            if (unitsperline)
                os << "\n";

        next:
            if (step) {
                ofs += step;
                p += step;
            }
            else {
                ofs += sizeof(T) * (pend-p);
                p = pend;
            }
        }
        clearflags(os);
    }